

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::IF(CPU *this)

{
  uint uVar1;
  longlong lVar2;
  mapped_type *pmVar3;
  uchar *puVar4;
  Lui *this_00;
  Auipc *this_01;
  Jal *this_02;
  Jalr *this_03;
  Control *this_04;
  Load *this_05;
  Store *this_06;
  I_class *this_07;
  R_class *this_08;
  uchar *data;
  operation op;
  int order_int;
  CPU *this_local;
  
  puVar4 = (this->CPU_MEM).mem;
  _op = this;
  lVar2 = memory::get_PC(&this->CPU_MEM);
  uVar1 = (uint)puVar4[lVar2];
  data._4_4_ = uVar1 - (uVar1 & 0xffffff80);
  pmVar3 = std::
           map<int,_operation,_std::less<int>,_std::allocator<std::pair<const_int,_operation>_>_>::
           operator[](&orders,(key_type *)((long)&data + 4));
  data._0_4_ = *pmVar3;
  puVar4 = (this->CPU_MEM).mem;
  lVar2 = memory::get_PC(&this->CPU_MEM);
  puVar4 = puVar4 + lVar2;
  switch((mapped_type)data) {
  case lui:
    this_00 = (Lui *)operator_new(0x28);
    Lui::Lui(this_00,puVar4);
    this->current_order = (order *)this_00;
    break;
  case auipc:
    this_01 = (Auipc *)operator_new(0x28);
    Auipc::Auipc(this_01,puVar4);
    this->current_order = (order *)this_01;
    break;
  case jal:
    this_02 = (Jal *)operator_new(0x30);
    Jal::Jal(this_02,puVar4);
    this->current_order = (order *)this_02;
    break;
  case jalr:
    this_03 = (Jalr *)operator_new(0x38);
    Jalr::Jalr(this_03,puVar4);
    this->current_order = (order *)this_03;
    break;
  case B:
    this_04 = (Control *)operator_new(0x38);
    Control::Control(this_04,puVar4);
    this->current_order = (order *)this_04;
    break;
  case ld:
    this_05 = (Load *)operator_new(0x40);
    Load::Load(this_05,puVar4);
    this->current_order = (order *)this_05;
    break;
  case S:
    this_06 = (Store *)operator_new(0x40);
    Store::Store(this_06,puVar4);
    this->current_order = (order *)this_06;
    break;
  case I:
    this_07 = (I_class *)operator_new(0x40);
    I_class::I_class(this_07,puVar4);
    this->current_order = (order *)this_07;
    break;
  case R:
    this_08 = (R_class *)operator_new(0x40);
    R_class::R_class(this_08,puVar4);
    this->current_order = (order *)this_08;
  }
  return;
}

Assistant:

void CPU::IF() {
    int order_int=int(CPU_MEM.mem[CPU_MEM.get_PC()]);
    order_int%=128;
    operation op=orders[order_int];
    unsigned char *data=CPU_MEM.mem+CPU_MEM.get_PC();
    switch(op){
        case lui:{current_order=new Lui(data); break;}
        case auipc:{current_order=new Auipc(data);break;}
        case jal:{current_order=new Jal(data);break;}
        case jalr:{current_order=new Jalr(data);break;}
        case B:{current_order=new Control(data);break;}
        case ld:{current_order=new Load(data);break;}
        case S:{current_order=new Store(data);break;}
        case I:{current_order=new I_class(data);break;}
        case R:{current_order=new R_class(data);break;}
    }
}